

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

int __thiscall jrtplib::RTPUDPv4Transmitter::CreateLocalIPList(RTPUDPv4Transmitter *this)

{
  bool bVar1;
  
  bVar1 = GetLocalIPList_Interfaces(this);
  if (!bVar1) {
    GetLocalIPList_DNS(this);
  }
  AddLoopbackAddress(this);
  return 0;
}

Assistant:

int RTPUDPv4Transmitter::CreateLocalIPList()
{
	 // first try to obtain the list from the network interface info

	if (!GetLocalIPList_Interfaces())
	{
		// If this fails, we'll have to depend on DNS info
		GetLocalIPList_DNS();
	}
	AddLoopbackAddress();
	return 0;
}